

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O0

bool __thiscall QPDF::isCached(QPDF *this,QPDFObjGen og)

{
  pointer pMVar1;
  size_type sVar2;
  QPDF *this_local;
  QPDFObjGen og_local;
  
  this_local = (QPDF *)og;
  pMVar1 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  sVar2 = std::
          map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
          ::count(&pMVar1->obj_cache,(key_type *)&this_local);
  return sVar2 != 0;
}

Assistant:

bool
QPDF::isCached(QPDFObjGen og)
{
    return m->obj_cache.count(og) != 0;
}